

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_put_error(int lib,int func,int reason,char *file,int line)

{
  ERR_STATE *pEVar1;
  uint *puVar2;
  err_error_st *error_00;
  err_error_st *error;
  ERR_STATE *state;
  uint line_local;
  char *file_local;
  int reason_local;
  int unused_local;
  int library_local;
  
  pEVar1 = err_get_state();
  if (pEVar1 != (ERR_STATE *)0x0) {
    file_local._4_4_ = reason;
    if ((lib == 2) && (reason == 0)) {
      puVar2 = (uint *)__errno_location();
      file_local._4_4_ = *puVar2;
    }
    pEVar1->top = pEVar1->top + 1 & 0xf;
    if (pEVar1->top == pEVar1->bottom) {
      pEVar1->bottom = pEVar1->bottom + 1 & 0xf;
    }
    error_00 = pEVar1->errors + pEVar1->top;
    err_clear(error_00);
    error_00->file = file;
    error_00->line = (uint16_t)line;
    error_00->packed = lib << 0x18 | file_local._4_4_ & 0xfff;
  }
  return;
}

Assistant:

void ERR_put_error(int library, int unused, int reason, const char *file,
                   unsigned line) {
  ERR_STATE *const state = err_get_state();
  struct err_error_st *error;

  if (state == NULL) {
    return;
  }

  if (library == ERR_LIB_SYS && reason == 0) {
#if defined(OPENSSL_WINDOWS)
    reason = GetLastError();
#else
    reason = errno;
#endif
  }

  state->top = (state->top + 1) % ERR_NUM_ERRORS;
  if (state->top == state->bottom) {
    state->bottom = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[state->top];
  err_clear(error);
  error->file = file;
  error->line = line;
  error->packed = ERR_PACK(library, reason);
}